

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaSAXHandleStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  xmlNodePtr node;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  xmlChar xVar9;
  xmlChar *pxVar10;
  int iVar11;
  xmlChar **ppxVar12;
  long lVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  xmlChar *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  
  iVar2 = *(int *)((long)ctx + 0xac) + 1;
  *(int *)((long)ctx + 0xac) = iVar2;
  if (*(int *)((long)ctx + 0x130) <= iVar2 && *(int *)((long)ctx + 0x130) != -1) {
    return;
  }
  iVar2 = xmlSchemaValidatorPushElem((xmlSchemaValidCtxtPtr)ctx);
  if (iVar2 == -1) {
    pcVar8 = "calling xmlSchemaValidatorPushElem()";
  }
  else {
    lVar1 = *(long *)((long)ctx + 0xc0);
    iVar2 = xmlSAX2GetLineNumber(*(void **)((long)ctx + 0x50));
    *(int *)(lVar1 + 0x10) = iVar2;
    *(xmlChar **)(lVar1 + 0x18) = localname;
    *(xmlChar **)(lVar1 + 0x20) = URI;
    *(byte *)(lVar1 + 0x40) = *(byte *)(lVar1 + 0x40) | 0x20;
    if (nb_namespaces != 0) {
      if (nb_namespaces < 1) {
        nb_namespaces = 0;
      }
      ppxVar12 = namespaces + 1;
      while (bVar14 = nb_namespaces != 0, nb_namespaces = nb_namespaces + -1, bVar14) {
        pvVar3 = *(void **)(lVar1 + 0x78);
        if (pvVar3 == (void *)0x0) {
          auVar15 = (undefined1  [16])(*xmlMalloc)(0x50);
          node = auVar15._8_8_;
          pvVar3 = auVar15._0_8_;
          *(void **)(lVar1 + 0x78) = pvVar3;
          if (pvVar3 == (void *)0x0) {
            pcVar8 = "allocating namespace bindings for SAX validation";
            goto LAB_001a9359;
          }
          *(undefined8 *)(lVar1 + 0x80) = 0x500000000;
          iVar2 = 0;
        }
        else {
          iVar6 = *(int *)(lVar1 + 0x84);
          iVar2 = *(int *)(lVar1 + 0x80);
          if (iVar6 <= iVar2) {
            *(int *)(lVar1 + 0x84) = iVar6 * 2;
            auVar15 = (undefined1  [16])(*xmlRealloc)(pvVar3,(long)iVar6 << 5);
            node = auVar15._8_8_;
            pvVar3 = auVar15._0_8_;
            *(void **)(lVar1 + 0x78) = pvVar3;
            if (pvVar3 == (void *)0x0) {
              pcVar8 = "re-allocating namespace bindings for SAX validation";
              goto LAB_001a9359;
            }
            iVar2 = *(int *)(lVar1 + 0x80);
          }
        }
        *(xmlChar **)((long)pvVar3 + (long)(iVar2 * 2) * 8) = ppxVar12[-1];
        pxVar10 = (xmlChar *)0x0;
        if (**ppxVar12 != '\0') {
          pxVar10 = *ppxVar12;
        }
        *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(iVar2 * 2 + 1) * 8) = pxVar10;
        *(int *)(lVar1 + 0x80) = iVar2 + 1;
        ppxVar12 = ppxVar12 + 2;
      }
    }
    if (nb_attributes != 0) {
      lVar13 = 0;
      if (nb_attributes < 1) {
        nb_attributes = 0;
      }
      for (iVar2 = 0; iVar2 != nb_attributes; iVar2 = iVar2 + 1) {
        iVar6 = *(int *)(attributes + lVar13 + 4) - *(int *)(attributes + lVar13 + 3);
        auVar15 = (undefined1  [16])(*xmlMallocAtomic)((long)(iVar6 + 1));
        node = auVar15._8_8_;
        lVar4 = auVar15._0_8_;
        if (lVar4 == 0) {
          pcVar8 = "allocating string for decoded attribute";
LAB_001a9359:
          xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx,pcVar8,node);
          goto LAB_001a935e;
        }
        uVar5 = 0;
        for (uVar7 = 0; (int)uVar7 < iVar6; uVar7 = uVar7 + iVar11) {
          pxVar10 = attributes[lVar13 + 3];
          xVar9 = pxVar10[uVar7];
          iVar11 = 1;
          if (((((int)uVar7 < iVar6 + -4) && (xVar9 == '&')) &&
              (xVar9 = '&', pxVar10[(ulong)uVar7 + 1] == '#')) &&
             ((pxVar10[(ulong)uVar7 + 2] == '3' && (pxVar10[(ulong)uVar7 + 3] == '8')))) {
            iVar11 = (uint)(pxVar10[(ulong)uVar7 + 4] == ';') * 4 + 1;
          }
          *(xmlChar *)(lVar4 + uVar5) = xVar9;
          uVar5 = uVar5 + 1;
        }
        *(undefined1 *)(lVar4 + (uVar5 & 0xffffffff)) = 0;
        iVar6 = xmlSchemaValidatorPushAttribute
                          ((xmlSchemaValidCtxtPtr)ctx,(xmlNodePtr)0x0,*(int *)(lVar1 + 0x10),
                           attributes[lVar13],attributes[lVar13 + 2],auVar15._0_4_,
                           in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
        if (iVar6 == -1) {
          pcVar8 = "calling xmlSchemaValidatorPushAttribute()";
          goto LAB_001a933c;
        }
        lVar13 = lVar13 + 5;
      }
    }
    iVar2 = xmlSchemaValidateElem((xmlSchemaValidCtxtPtr)ctx);
    if (iVar2 != -1) {
      return;
    }
    pcVar8 = "calling xmlSchemaValidateElem()";
  }
LAB_001a933c:
  xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",pcVar8);
LAB_001a935e:
  *(undefined4 *)((long)ctx + 0x68) = 0xffffffff;
  xmlStopParser(*(xmlParserCtxtPtr *)((long)ctx + 0x50));
  return;
}

Assistant:

static void
xmlSchemaSAXHandleStartElementNs(void *ctx,
				 const xmlChar * localname,
				 const xmlChar * prefix ATTRIBUTE_UNUSED,
				 const xmlChar * URI,
				 int nb_namespaces,
				 const xmlChar ** namespaces,
				 int nb_attributes,
				 int nb_defaulted ATTRIBUTE_UNUSED,
				 const xmlChar ** attributes)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;
    int ret;
    xmlSchemaNodeInfoPtr ielem;
    int i, j;

    /*
    * SAX VAL TODO: What to do with nb_defaulted?
    */
    /*
    * Skip elements if inside a "skip" wildcard or invalid.
    */
    vctxt->depth++;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    /*
    * Push the element.
    */
    if (xmlSchemaValidatorPushElem(vctxt) == -1) {
	VERROR_INT("xmlSchemaSAXHandleStartElementNs",
	    "calling xmlSchemaValidatorPushElem()");
	goto internal_error;
    }
    ielem = vctxt->inode;
    /*
    * TODO: Is this OK?
    */
    ielem->nodeLine = xmlSAX2GetLineNumber(vctxt->parserCtxt);
    ielem->localName = localname;
    ielem->nsName = URI;
    ielem->flags |= XML_SCHEMA_ELEM_INFO_EMPTY;
    /*
    * Register namespaces on the elem info.
    */
    if (nb_namespaces != 0) {
	/*
	* Although the parser builds its own namespace list,
	* we have no access to it, so we'll use an own one.
	*/
        for (i = 0, j = 0; i < nb_namespaces; i++, j += 2) {
	    /*
	    * Store prefix and namespace name.
	    */
	    if (ielem->nsBindings == NULL) {
		ielem->nsBindings =
		    (const xmlChar **) xmlMalloc(10 *
			sizeof(const xmlChar *));
		if (ielem->nsBindings == NULL) {
		    xmlSchemaVErrMemory(vctxt,
			"allocating namespace bindings for SAX validation",
			NULL);
		    goto internal_error;
		}
		ielem->nbNsBindings = 0;
		ielem->sizeNsBindings = 5;
	    } else if (ielem->sizeNsBindings <= ielem->nbNsBindings) {
		ielem->sizeNsBindings *= 2;
		ielem->nsBindings =
		    (const xmlChar **) xmlRealloc(
			(void *) ielem->nsBindings,
			ielem->sizeNsBindings * 2 * sizeof(const xmlChar *));
		if (ielem->nsBindings == NULL) {
		    xmlSchemaVErrMemory(vctxt,
			"re-allocating namespace bindings for SAX validation",
			NULL);
		    goto internal_error;
		}
	    }

	    ielem->nsBindings[ielem->nbNsBindings * 2] = namespaces[j];
	    if (namespaces[j+1][0] == 0) {
		/*
		* Handle xmlns="".
		*/
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] = NULL;
	    } else
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] =
		    namespaces[j+1];
	    ielem->nbNsBindings++;
	}
    }
    /*
    * Register attributes.
    * SAX VAL TODO: We are not adding namespace declaration
    * attributes yet.
    */
    if (nb_attributes != 0) {
	int valueLen, k, l;
	xmlChar *value;

        for (j = 0, i = 0; i < nb_attributes; i++, j += 5) {
	    /*
	    * Duplicate the value, changing any &#38; to a literal ampersand.
	    *
	    * libxml2 differs from normal SAX here in that it escapes all ampersands
	    * as &#38; instead of delivering the raw converted string. Changing the
	    * behavior at this point would break applications that use this API, so
	    * we are forced to work around it.
	    */
	    valueLen = attributes[j+4] - attributes[j+3];
	    value = xmlMallocAtomic(valueLen + 1);
	    if (value == NULL) {
		xmlSchemaVErrMemory(vctxt,
		    "allocating string for decoded attribute",
		    NULL);
		goto internal_error;
	    }
	    for (k = 0, l = 0; k < valueLen; l++) {
		if (k < valueLen - 4 &&
		    attributes[j+3][k+0] == '&' &&
		    attributes[j+3][k+1] == '#' &&
		    attributes[j+3][k+2] == '3' &&
		    attributes[j+3][k+3] == '8' &&
		    attributes[j+3][k+4] == ';') {
		    value[l] = '&';
		    k += 5;
		} else {
		    value[l] = attributes[j+3][k];
		    k++;
		}
	    }
	    value[l] = '\0';
	    /*
	    * TODO: Set the node line.
	    */
	    ret = xmlSchemaValidatorPushAttribute(vctxt,
		NULL, ielem->nodeLine, attributes[j], attributes[j+2], 0,
		value, 1);
	    if (ret == -1) {
		VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		    "calling xmlSchemaValidatorPushAttribute()");
		goto internal_error;
	    }
	}
    }
    /*
    * Validate the element.
    */
    ret = xmlSchemaValidateElem(vctxt);
    if (ret != 0) {
	if (ret == -1) {
	    VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		"calling xmlSchemaValidateElem()");
	    goto internal_error;
	}
	goto exit;
    }

exit:
    return;
internal_error:
    vctxt->err = -1;
    xmlStopParser(vctxt->parserCtxt);
    return;
}